

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O3

void __thiscall OPL3::SetPanning(OPL3 *this,int c,float left,float right)

{
  Channel *pCVar1;
  undefined1 auVar2 [16];
  Channel **ppCVar3;
  
  if (this->FullPan == true) {
    ppCVar3 = (Channel **)((this->disabledChannel).super_Channel.feedback + ((ulong)(c - 9) - 10));
    if (c < 9) {
      ppCVar3 = this->channels[0] + c;
    }
    pCVar1 = *ppCVar3;
    auVar2._8_4_ = SUB84((double)right,0);
    auVar2._0_8_ = (double)left;
    auVar2._12_4_ = (int)((ulong)(double)right >> 0x20);
    pCVar1->leftPan = (double)left;
    pCVar1->rightPan = (double)auVar2._8_8_;
  }
  return;
}

Assistant:

void OPL3::SetPanning(int c, float left, float right)
{
	if (FullPan)
	{
		Channel *channel;

		if (c < 9)
		{
			channel = channels[0][c];
		}
		else
		{
			channel = channels[1][c - 9];
		}
		channel->leftPan = left;
		channel->rightPan = right;
	}
}